

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_function_apply(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue this_obj;
  JSValue new_target;
  int iVar1;
  JSValue *argv_00;
  ulong uVar2;
  JSValue JVar3;
  JSValue JVar4;
  uint32_t len;
  JSValueUnion local_40;
  int64_t local_38;
  
  iVar1 = check_function(ctx,this_val);
  if (iVar1 == 0) {
    local_40 = (JSValueUnion)(argv->u).ptr;
    local_38 = argv->tag;
    if (magic != 2 && ((uint)argv[1].tag & 0xfffffffe) == 2) {
      JVar3 = JS_Call(ctx,this_val,*argv,0,(JSValue *)0x0);
      uVar2 = (ulong)JVar3.u.ptr & 0xffffffff00000000;
      goto LAB_00130e4b;
    }
    JVar3.tag = argv[1].tag;
    JVar3.u.ptr = argv[1].u.ptr;
    argv_00 = build_arg_list(ctx,&len,JVar3);
    if (argv_00 != (JSValue *)0x0) {
      if ((magic & 1U) == 0) {
        this_obj.tag = local_38;
        this_obj.u.ptr = local_40.ptr;
        JVar3 = JS_Call(ctx,this_val,this_obj,len,argv_00);
      }
      else {
        new_target.tag = local_38;
        new_target.u.ptr = local_40.ptr;
        JVar3 = JS_CallConstructor2(ctx,this_val,new_target,len,argv_00);
      }
      free_arg_list(ctx,argv_00,len);
      uVar2 = (ulong)JVar3.u.ptr & 0xffffffff00000000;
      goto LAB_00130e4b;
    }
  }
  JVar3 = (JSValue)(ZEXT816(6) << 0x40);
  uVar2 = 0;
LAB_00130e4b:
  JVar4.u.ptr = (void *)((ulong)JVar3.u.ptr & 0xffffffff | uVar2);
  JVar4.tag = JVar3.tag;
  return JVar4;
}

Assistant:

static JSValue js_function_apply(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv, int magic)
{
    JSValueConst this_arg, array_arg;
    uint32_t len;
    JSValue *tab, ret;

    if (check_function(ctx, this_val))
        return JS_EXCEPTION;
    this_arg = argv[0];
    array_arg = argv[1];
    if ((JS_VALUE_GET_TAG(array_arg) == JS_TAG_UNDEFINED ||
         JS_VALUE_GET_TAG(array_arg) == JS_TAG_NULL) && magic != 2) {
        return JS_Call(ctx, this_val, this_arg, 0, NULL);
    }
    tab = build_arg_list(ctx, &len, array_arg);
    if (!tab)
        return JS_EXCEPTION;
    if (magic & 1) {
        ret = JS_CallConstructor2(ctx, this_val, this_arg, len, (JSValueConst *)tab);
    } else {
        ret = JS_Call(ctx, this_val, this_arg, len, (JSValueConst *)tab);
    }
    free_arg_list(ctx, tab, len);
    return ret;
}